

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool list_join(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_class_t *__src;
  int iVar2;
  uint uVar3;
  char *s;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  uint32_t len;
  ulong uVar5;
  gravity_class_t *pgVar6;
  _Bool _Var7;
  gravity_class_t *pgVar8;
  long lVar9;
  bool bVar10;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar11;
  size_t local_68;
  gravity_class_t *local_60;
  size_t local_50;
  
  pgVar1 = (args->field_1).p;
  if ((nargs < 2) || (args[1].isa != gravity_class_string)) {
    uVar3 = *(int *)&pgVar1->objclass << 6;
    local_50 = 0x100;
    if (uVar3 != 0) {
      local_50 = (size_t)uVar3;
    }
  }
  else {
    local_60 = (args[1].field_1.p)->objclass;
    uVar3 = *(int *)&pgVar1->objclass << 6;
    local_50 = 0x100;
    if (uVar3 != 0) {
      local_50 = (size_t)uVar3;
    }
    if (local_60 != (gravity_class_t *)0x0) {
      local_68 = (size_t)*(uint *)((long)&(args[1].field_1.p)->identifier + 4);
      goto LAB_0011b10a;
    }
  }
  local_60 = (gravity_class_t *)0x0;
  local_68 = 0;
LAB_0011b10a:
  s = (char *)gravity_calloc(vm,1,local_50);
  if (s == (char *)0x0) {
LAB_0011b255:
    _Var7 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  else {
    pgVar6 = pgVar1->objclass;
    if ((long)pgVar6 < 1) {
      len = 0;
    }
    else {
      uVar5 = 0;
      lVar9 = 8;
      pgVar8 = (gravity_class_t *)0x1;
      do {
        gVar11.field_1.n =
             ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(*(long *)&pgVar1->has_outer + lVar9)
             )->n;
        gVar11.isa = *(gravity_class_t **)(*(long *)&pgVar1->has_outer + -8 + lVar9);
        gVar11 = convert_value2string(vm,gVar11);
        aVar4 = gVar11.field_1;
        if (gVar11.isa == (gravity_class_t *)0x0) {
          free(s);
          pgVar6 = (gravity_class_t *)0x0;
          goto LAB_0011b2c5;
        }
        __src = (aVar4.p)->objclass;
        uVar3 = *(uint32_t *)((long)&(aVar4.p)->identifier + 4);
        iVar2 = (int)local_68;
        if ((uint)((int)local_50 - (int)uVar5) < uVar3 + iVar2 + 1) {
          local_50 = (size_t)((int)local_50 + (uVar3 + iVar2) * 2 + 0x1000);
          s = (char *)gravity_realloc(vm,s,local_50);
          if (s == (char *)0x0) goto LAB_0011b255;
        }
        memcpy(s + uVar5,__src,(ulong)uVar3);
        uVar3 = (int)uVar5 + uVar3;
        uVar5 = (ulong)uVar3;
        s[uVar5] = '\0';
        if (((long)pgVar8 < (long)pgVar6) && (iVar2 != 0)) {
          memcpy(s + uVar5,local_60,local_68);
          uVar5 = (ulong)(uVar3 + iVar2);
          s[uVar5] = '\0';
        }
        len = (uint32_t)uVar5;
        lVar9 = lVar9 + 0x10;
        bVar10 = pgVar8 != pgVar6;
        pgVar8 = (gravity_class_t *)((long)&pgVar8->isa + 1);
      } while (bVar10);
    }
    aVar4.p = (gravity_object_t *)gravity_string_new(vm,s,len,(uint32_t)local_50);
    pgVar6 = (aVar4.p)->isa;
LAB_0011b2c5:
    value_00.field_1.n = aVar4.n;
    value_00.isa = pgVar6;
    gravity_vm_setslot(vm,value_00,rindex);
    _Var7 = true;
  }
  return _Var7;
}

Assistant:

static bool list_join (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    const char *sep = NULL;
    if ((nargs > 1) && VALUE_ISA_STRING(GET_VALUE(1))) sep = VALUE_AS_CSTRING(GET_VALUE(1));

    // create a new empty buffer
    uint32_t alloc = (uint32_t) (marray_size(list->array) * 64);
    if (alloc == 0) alloc = 256;
    uint32_t len = 0;
    uint32_t seplen = (sep) ? VALUE_AS_STRING(GET_VALUE(1))->len : 0;
    char *_buffer = mem_alloc(vm, alloc);
    CHECK_MEM_ALLOC(_buffer);

    register gravity_int_t n = marray_size(list->array);
    register gravity_int_t i = 0;

    // traverse list and append each item
    while (i < n) {
        gravity_value_t value = convert_value2string(vm, marray_get(list->array, i));
        if (VALUE_ISA_ERROR(value)) {
            mem_free(_buffer);
            RETURN_VALUE(value, rindex);
        }

        // compute string to append
        const char *s2 = VALUE_AS_STRING(value)->s;
        uint32_t req = VALUE_AS_STRING(value)->len;
        uint32_t free_mem = alloc - len;

        // check if buffer needs to be reallocated
        if (free_mem < req + seplen + 1) {
            uint64_t to_alloc = alloc + (req + seplen) * 2 + 4096;
            _buffer = mem_realloc(vm, _buffer, (uint32_t)to_alloc);
            if (!_buffer) {
                mem_free(_buffer);
                RETURN_ERROR_SIMPLE();
            }
            alloc = (uint32_t)to_alloc;
        }

        // copy s2 to into buffer
        memcpy(_buffer+len, s2, req);
        len += req;

        // NULL terminate the C string
        _buffer[len] = 0;
        
        // check for separator string
        if (i+1 < n && seplen) {
            memcpy(_buffer+len, sep, seplen);
            len += seplen;
            _buffer[len] = 0;
        }

        ++i;
    }

    gravity_string_t *result = gravity_string_new(vm, _buffer, len, alloc);
    RETURN_VALUE(VALUE_FROM_OBJECT(result), rindex);
}